

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_filehandle.cc
# Opt level: O3

RC __thiscall
RM_FileHandle::GetFirstZeroBit(RM_FileHandle *this,char *bitmap,int size,int *location)

{
  uint uVar1;
  
  if (0 < size) {
    uVar1 = 0;
    do {
      if (((byte)bitmap[uVar1 >> 3] >> (uVar1 & 7) & 1) == 0) {
        *location = uVar1;
        return 0;
      }
      uVar1 = uVar1 + 1;
    } while (size != uVar1);
  }
  return 0x69;
}

Assistant:

RC RM_FileHandle::GetFirstZeroBit(char *bitmap, int size, int &location){
  for(int i = 0; i < size; i++){
    int chunk = i /8;
    int offset = i - chunk*8;
    if ((bitmap[chunk] & (1 << offset)) == 0){
      location = i;
      return (0);
    }
  }
  return RM_PAGEFULL;
}